

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_compressionParameters *pZVar1;
  ZSTD_paramSwitch_e ZVar2;
  U32 UVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  BYTE *pBVar24;
  BYTE *pBVar25;
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters cPar;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  U32 UVar29;
  U32 end;
  int iVar30;
  uint uVar31;
  ZSTD_TraceCtx ZVar32;
  size_t sVar33;
  size_t sVar34;
  ulong uVar35;
  uint uVar36;
  size_t __n;
  ZSTD_matchState_t *dstMatchState;
  ZSTD_matchState_t *srcMatchState;
  size_t tagTableSize;
  undefined4 uVar37;
  undefined4 uVar38;
  uint uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  ZSTD_strategy ZStack_120;
  ZSTD_CCtx_params local_108;
  
  sVar34 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    sVar34 = cdict->dictContentSize;
  }
  ZVar32 = ZSTD_trace_compress_begin(cctx);
  cctx->traceCtx = ZVar32;
  pZVar1 = &params->cParams;
  uVar4 = pZVar1->windowLog;
  uVar5 = pZVar1->chainLog;
  uVar6 = (params->cParams).hashLog;
  uVar7 = (params->cParams).searchLog;
  uVar26 = pZVar1->windowLog;
  uVar27 = pZVar1->chainLog;
  uVar28 = pZVar1->hashLog;
  cParams.hashLog = uVar28;
  cParams.chainLog = uVar27;
  cParams.windowLog = uVar26;
  uVar8 = (params->cParams).minMatch;
  uVar9 = (params->cParams).targetLength;
  uVar10 = (params->cParams).strategy;
  cParams.searchLog = uVar7;
  cParams.minMatch = uVar8;
  cParams.targetLength = uVar9;
  cParams.strategy = uVar10;
  local_108.format = uVar4;
  local_108.cParams.windowLog = uVar5;
  local_108.cParams.chainLog = uVar6;
  local_108.cParams.hashLog = uVar7;
  local_108.cParams.searchLog = uVar8;
  local_108.cParams.minMatch = uVar9;
  local_108.cParams.targetLength = uVar10;
  sVar33 = ZSTD_checkCParams(cParams);
  if (0xffffffffffffff88 < sVar33) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1396,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if (dict != (void *)0x0 && cdict != (ZSTD_CDict *)0x0) {
    __assert_fail("!((dict) && (cdict))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x1397,
                  "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                 );
  }
  if ((((cdict == (ZSTD_CDict *)0x0) || (sVar33 = cdict->dictContentSize, sVar33 == 0)) ||
      ((0x1ffff < pledgedSrcSize &&
       (((pledgedSrcSize != 0xffffffffffffffff &&
         (sVar33 * 6 < pledgedSrcSize || sVar33 * 6 - pledgedSrcSize == 0)) &&
        (cdict->compressionLevel != 0)))))) || (params->attachDictPref == ZSTD_dictForceLoad)) {
    sVar33 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar34,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar33) {
      return sVar33;
    }
    if (cdict == (ZSTD_CDict *)0x0) {
      uVar37 = SUB84(cctx->entropyWorkspace,0);
      uVar38 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
    }
    else {
      dict = cdict->dictContent;
      dictContentType = cdict->dictContentType;
      uVar37 = SUB84(cctx->entropyWorkspace,0);
      uVar38 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      dictSize = cdict->dictContentSize;
    }
    sVar33 = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&cctx->ldmState
                        ,&cctx->workspace,&cctx->appliedParams,dict,dictSize,dictContentType,dtlm,
                        ZSTD_tfp_forCCtx,(void *)CONCAT44(uVar38,uVar37));
    if (0xffffffffffffff88 < sVar33) {
      return sVar33;
    }
    if (sVar33 >> 0x20 != 0) {
      __assert_fail("dictID <= UINT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x13b0,
                    "size_t ZSTD_compressBegin_internal(ZSTD_CCtx *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, const ZSTD_CDict *, const ZSTD_CCtx_params *, U64, ZSTD_buffered_policy_e)"
                   );
    }
    cctx->dictID = (U32)sVar33;
    cctx->dictContentSize = sVar34;
  }
  else {
    iVar30 = ZSTD_shouldAttachDict(cdict,params,pledgedSrcSize);
    if (iVar30 == 0) {
      memcpy(&local_108,params,0xd0);
      if ((cdict->matchState).dedicatedDictSearch != 0) {
        __assert_fail("!cdict->matchState.dedicatedDictSearch",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x932,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      if (local_108.cParams.windowLog == 0) {
        __assert_fail("windowLog != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x937,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      pZVar1 = &(cdict->matchState).cParams;
      uVar18 = pZVar1->chainLog;
      uVar19 = (cdict->matchState).cParams.hashLog;
      uVar20 = (cdict->matchState).cParams.searchLog;
      uVar21 = (cdict->matchState).cParams.minMatch;
      uVar22 = (cdict->matchState).cParams.targetLength;
      uVar23 = (cdict->matchState).cParams.strategy;
      ZVar2 = cdict->useRowMatchFinder;
      local_108.cParams.chainLog = uVar18;
      local_108.cParams.hashLog = uVar19;
      local_108.cParams.searchLog = uVar20;
      local_108.cParams.minMatch = uVar21;
      local_108.cParams.targetLength = uVar22;
      local_108.cParams.strategy = uVar23;
      local_108.useRowMatchFinder = ZVar2;
      sVar34 = ZSTD_resetCCtx_internal(cctx,&local_108,pledgedSrcSize,0,ZSTDcrp_leaveDirty,zbuff);
      if (0xffffffffffffff88 < sVar34) {
        return sVar34;
      }
      if ((cctx->appliedParams).cParams.strategy != (cdict->matchState).cParams.strategy) {
        __assert_fail("cctx->appliedParams.cParams.strategy == cdict_cParams->strategy",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x93f,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      if ((cctx->appliedParams).cParams.hashLog != (cdict->matchState).cParams.hashLog) {
        __assert_fail("cctx->appliedParams.cParams.hashLog == cdict_cParams->hashLog",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x940,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      if ((cctx->appliedParams).cParams.chainLog != (cdict->matchState).cParams.chainLog) {
        __assert_fail("cctx->appliedParams.cParams.chainLog == cdict_cParams->chainLog",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x941,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      ZSTD_cwksp_mark_tables_dirty(&cctx->workspace);
      if (ZVar2 == ZSTD_ps_auto) {
        __assert_fail("params.useRowMatchFinder != ZSTD_ps_auto",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x945,
                      "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                     );
      }
      sVar34 = 0;
      iVar30 = ZSTD_allocateChainTable
                         ((cdict->matchState).cParams.strategy,cdict->useRowMatchFinder,0);
      if (iVar30 != 0) {
        sVar34 = 1L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
      }
      sVar33 = 1L << ((byte)(cdict->matchState).cParams.hashLog & 0x3f);
      ZSTD_copyCDictTableIntoCCtx
                ((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,sVar33,pZVar1
                );
      iVar30 = ZSTD_allocateChainTable
                         ((cctx->appliedParams).cParams.strategy,
                          (cctx->appliedParams).useRowMatchFinder,0);
      if (iVar30 != 0) {
        ZSTD_copyCDictTableIntoCCtx
                  ((cctx->blockState).matchState.chainTable,(cdict->matchState).chainTable,sVar34,
                   pZVar1);
      }
      iVar30 = ZSTD_rowMatchFinderUsed
                         ((cdict->matchState).cParams.strategy,cdict->useRowMatchFinder);
      if (iVar30 != 0) {
        memcpy((cctx->blockState).matchState.tagTable,(cdict->matchState).tagTable,sVar33);
        (cctx->blockState).matchState.hashSalt = (cdict->matchState).hashSalt;
      }
      if ((cdict->matchState).hashLog3 == 0) {
        UVar3 = (cctx->blockState).matchState.hashLog3;
        __n = 4L << ((byte)UVar3 & 0x3f);
        if (UVar3 == 0) {
          __n = 0;
        }
        memset((cctx->blockState).matchState.hashTable3,0,__n);
        ZSTD_cwksp_mark_tables_clean(&cctx->workspace);
        uVar37 = *(undefined4 *)&(cdict->matchState).window.field_0x24;
        (cctx->blockState).matchState.window.nbOverflowCorrections =
             (cdict->matchState).window.nbOverflowCorrections;
        *(undefined4 *)&(cctx->blockState).matchState.window.field_0x24 = uVar37;
        pBVar24 = (cdict->matchState).window.nextSrc;
        pBVar25 = (cdict->matchState).window.base;
        UVar3 = (cdict->matchState).window.dictLimit;
        UVar29 = (cdict->matchState).window.lowLimit;
        (cctx->blockState).matchState.window.dictBase = (cdict->matchState).window.dictBase;
        (cctx->blockState).matchState.window.dictLimit = UVar3;
        (cctx->blockState).matchState.window.lowLimit = UVar29;
        (cctx->blockState).matchState.window.nextSrc = pBVar24;
        (cctx->blockState).matchState.window.base = pBVar25;
        UVar3 = (cdict->matchState).nextToUpdate;
        (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
        (cctx->blockState).matchState.nextToUpdate = UVar3;
        cctx->dictID = cdict->dictID;
        cctx->dictContentSize = cdict->dictContentSize;
        memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x1600);
        return 0;
      }
      __assert_fail("cdict->matchState.hashLog3 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x964,
                    "size_t ZSTD_resetCCtx_byCopyingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    memcpy(&local_108,params,0xd0);
    uVar31 = local_108.cParams.windowLog;
    uVar11 = (cdict->matchState).cParams.windowLog;
    uVar12 = (cdict->matchState).cParams.chainLog;
    cPar.chainLog = uVar12;
    cPar.windowLog = uVar11;
    uVar13 = (cdict->matchState).cParams.hashLog;
    uVar14 = (cdict->matchState).cParams.searchLog;
    uVar15 = (cdict->matchState).cParams.minMatch;
    uVar16 = (cdict->matchState).cParams.targetLength;
    uVar17 = (cdict->matchState).cParams.strategy;
    if (local_108.cParams.windowLog == 0) {
      __assert_fail("windowLog != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x8e8,
                    "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    uStack_130 = uVar13;
    if (((cdict->matchState).dedicatedDictSearch != 0) &&
       (uStack_130 = uVar13, uVar17 - ZSTD_greedy < 3)) {
      uStack_130 = 6;
      if (6 < uVar13 - 2) {
        uStack_130 = uVar13 - 2;
      }
    }
    cPar.hashLog = uStack_130;
    cPar.searchLog = uVar14;
    cPar.minMatch = uVar15;
    cPar.targetLength = uVar16;
    cPar.strategy = uVar17;
    ZSTD_adjustCParams_internal
              (&local_108.cParams,cPar,pledgedSrcSize,sVar33,ZSTD_cpm_attachDict,
               local_108.useRowMatchFinder);
    local_108.useRowMatchFinder = cdict->useRowMatchFinder;
    local_108.cParams.windowLog = uVar31;
    sVar34 = ZSTD_resetCCtx_internal(cctx,&local_108,pledgedSrcSize,0,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar34) {
      return sVar34;
    }
    if ((cctx->appliedParams).cParams.strategy != uVar17) {
      __assert_fail("cctx->appliedParams.cParams.strategy == adjusted_cdict_cParams.strategy",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x8f9,
                    "size_t ZSTD_resetCCtx_byAttachingCDict(ZSTD_CCtx *, const ZSTD_CDict *, ZSTD_CCtx_params, U64, ZSTD_buffered_policy_e)"
                   );
    }
    uVar35 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
    uVar31 = (uint)uVar35;
    if ((cdict->matchState).window.dictLimit != uVar31) {
      (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
      uVar36 = (cctx->blockState).matchState.window.dictLimit;
      if (uVar36 < uVar31) {
        (cctx->blockState).matchState.window.nextSrc =
             (cctx->blockState).matchState.window.base + (uVar35 & 0xffffffff);
        (cctx->blockState).matchState.window.lowLimit = uVar31;
        (cctx->blockState).matchState.window.dictLimit = uVar31;
        uVar36 = uVar31;
      }
      (cctx->blockState).matchState.loadedDictEnd = uVar36;
    }
    cctx->dictID = cdict->dictID;
    cctx->dictContentSize = cdict->dictContentSize;
    memcpy((cctx->blockState).prevCBlock,&cdict->cBlockState,0x1600);
  }
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        ZSTD_tfp_forCCtx, cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, ZSTD_tfp_forCCtx, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}